

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int unixFetch(sqlite3_file *fd,i64 iOff,int nAmt,void **pp)

{
  int iVar1;
  long *in_RCX;
  int in_EDX;
  long in_RSI;
  unixFile *in_RDI;
  int rc;
  int nEofBuffer;
  unixFile *pFd;
  undefined4 in_stack_ffffffffffffffc8;
  
  *in_RCX = 0;
  if (0 < in_RDI->mmapSizeMax) {
    if ((in_RDI->pMapRegion == (void *)0x0) &&
       (iVar1 = unixMapfile(in_RDI,CONCAT44(0x100,in_stack_ffffffffffffffc8)), iVar1 != 0)) {
      return iVar1;
    }
    if (in_RSI + in_EDX + 0x100 <= in_RDI->mmapSize) {
      *in_RCX = (long)in_RDI->pMapRegion + in_RSI;
      in_RDI->nFetchOut = in_RDI->nFetchOut + 1;
    }
  }
  return 0;
}

Assistant:

static int unixFetch(sqlite3_file *fd, i64 iOff, int nAmt, void **pp){
#if SQLITE_MAX_MMAP_SIZE>0
  unixFile *pFd = (unixFile *)fd;   /* The underlying database file */
#endif
  *pp = 0;

#if SQLITE_MAX_MMAP_SIZE>0
  if( pFd->mmapSizeMax>0 ){
    /* Ensure that there is always at least a 256 byte buffer of addressable
    ** memory following the returned page. If the database is corrupt,
    ** SQLite may overread the page slightly (in practice only a few bytes,
    ** but 256 is safe, round, number).  */
    const int nEofBuffer = 256;
    if( pFd->pMapRegion==0 ){
      int rc = unixMapfile(pFd, -1);
      if( rc!=SQLITE_OK ) return rc;
    }
    if( pFd->mmapSize >= (iOff+nAmt+nEofBuffer) ){
      *pp = &((u8 *)pFd->pMapRegion)[iOff];
      pFd->nFetchOut++;
    }
  }
#endif
  return SQLITE_OK;
}